

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O2

void __thiscall
clickhouse::ColumnEnum<short>::ColumnEnum
          (ColumnEnum<short> *this,TypeRef *type,vector<short,_std::allocator<short>_> *data)

{
  __shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  std::__shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,&type->super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>);
  Column::Column(&this->super_Column,(TypeRef *)&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  (this->super_Column)._vptr_Column = (_func_int **)&PTR__ColumnEnum_00185c00;
  std::vector<short,_std::allocator<short>_>::vector(&this->data_,data);
  return;
}

Assistant:

ColumnEnum<T>::ColumnEnum(TypeRef type, const std::vector<T>& data)
    : Column(type)
    , data_(data)
{
}